

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseInfo::TestCaseInfo(TestCaseInfo *this,TestCaseInfo *other)

{
  std::__cxx11::string::string((string *)this,(string *)other);
  std::__cxx11::string::string((string *)&this->className,(string *)&other->className);
  std::__cxx11::string::string((string *)&this->description,(string *)&other->description);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->tags)._M_t,&(other->tags)._M_t);
  std::__cxx11::string::string((string *)&this->tagsAsString,(string *)&other->tagsAsString);
  SourceLineInfo::SourceLineInfo(&this->lineInfo,&other->lineInfo);
  this->isHidden = other->isHidden;
  return;
}

Assistant:

TestCaseInfo::TestCaseInfo( TestCaseInfo const& other )
    :   name( other.name ),
        className( other.className ),
        description( other.description ),
        tags( other.tags ),
        tagsAsString( other.tagsAsString ),
        lineInfo( other.lineInfo ),
        isHidden( other.isHidden )
    {}